

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void constInsert(WhereConst *pConst,Expr *pColumn,Expr *pValue,Expr *pExpr)

{
  int iVar1;
  long lVar2;
  char cVar3;
  CollSeq *pCVar4;
  Expr **ppEVar5;
  long lVar6;
  
  if ((((pColumn->flags & 0x20) == 0) && (cVar3 = sqlite3ExprAffinity(pValue), cVar3 == '\0')) &&
     ((pCVar4 = sqlite3ExprCompareCollSeq(pConst->pParse,pExpr), pCVar4 == (CollSeq *)0x0 ||
      (pCVar4->xCmp == binCollFunc)))) {
    if (0 < (long)pConst->nConst) {
      lVar6 = 0;
      do {
        lVar2 = *(long *)((long)pConst->apExpr + lVar6);
        if ((*(int *)(lVar2 + 0x2c) == pColumn->iTable) &&
           (*(short *)(lVar2 + 0x30) == pColumn->iColumn)) {
          return;
        }
        lVar6 = lVar6 + 0x10;
      } while ((long)pConst->nConst * 0x10 != lVar6);
    }
    cVar3 = sqlite3ExprAffinity(pColumn);
    if (cVar3 == 'A') {
      pConst->bHasAffBlob = 1;
    }
    lVar6 = (long)pConst->nConst + 1;
    pConst->nConst = (int)lVar6;
    ppEVar5 = (Expr **)sqlite3DbReallocOrFree(pConst->pParse->db,pConst->apExpr,lVar6 * 0x10);
    pConst->apExpr = ppEVar5;
    if (ppEVar5 == (Expr **)0x0) {
      pConst->nConst = 0;
    }
    else {
      iVar1 = pConst->nConst;
      ppEVar5[(long)iVar1 * 2 + -2] = pColumn;
      pConst->apExpr[(long)iVar1 * 2 + -1] = pValue;
    }
  }
  return;
}

Assistant:

static void constInsert(
  WhereConst *pConst,  /* The WhereConst into which we are inserting */
  Expr *pColumn,       /* The COLUMN part of the constraint */
  Expr *pValue,        /* The VALUE part of the constraint */
  Expr *pExpr          /* Overall expression: COLUMN=VALUE or VALUE=COLUMN */
){
  int i;
  assert( pColumn->op==TK_COLUMN );
  assert( sqlite3ExprIsConstant(pValue) );

  if( ExprHasProperty(pColumn, EP_FixedCol) ) return;
  if( sqlite3ExprAffinity(pValue)!=0 ) return;
  if( !sqlite3IsBinary(sqlite3ExprCompareCollSeq(pConst->pParse,pExpr)) ){
    return;
  }

  /* 2018-10-25 ticket [cf5ed20f]
  ** Make sure the same pColumn is not inserted more than once */
  for(i=0; i<pConst->nConst; i++){
    const Expr *pE2 = pConst->apExpr[i*2];
    assert( pE2->op==TK_COLUMN );
    if( pE2->iTable==pColumn->iTable
     && pE2->iColumn==pColumn->iColumn
    ){
      return;  /* Already present.  Return without doing anything. */
    }
  }
  if( sqlite3ExprAffinity(pColumn)==SQLITE_AFF_BLOB ){
    pConst->bHasAffBlob = 1;
  }

  pConst->nConst++;
  pConst->apExpr = sqlite3DbReallocOrFree(pConst->pParse->db, pConst->apExpr,
                         pConst->nConst*2*sizeof(Expr*));
  if( pConst->apExpr==0 ){
    pConst->nConst = 0;
  }else{
    pConst->apExpr[pConst->nConst*2-2] = pColumn;
    pConst->apExpr[pConst->nConst*2-1] = pValue;
  }
}